

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibustypes.cpp
# Opt level: O2

QTextCharFormat * __thiscall
QIBusAttribute::format(QTextCharFormat *__return_storage_ptr__,QIBusAttribute *this)

{
  Type TVar1;
  long in_FS_OFFSET;
  QBrush aQStack_38 [8];
  QColor local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)__return_storage_ptr__ = 0xaaaaaaaaaaaaaaaa;
  *(undefined8 *)&__return_storage_ptr__->field_0x8 = 0xaaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat(__return_storage_ptr__);
  TVar1 = this->type;
  if (TVar1 == Background) {
    QColor::QColor(&local_30,this->value);
    QBrush::QBrush(aQStack_38,&local_30,SolidPattern);
    QTextFormat::setBackground(&__return_storage_ptr__->super_QTextFormat,aQStack_38);
  }
  else {
    if (TVar1 != Foreground) {
      if (TVar1 == Underline) {
        switch(this->value) {
        case 3:
          break;
        case 4:
          QColor::QColor(&local_30,red);
          QTextCharFormat::setUnderlineColor(__return_storage_ptr__,&local_30);
        }
        QTextCharFormat::setUnderlineStyle((UnderlineStyle)__return_storage_ptr__);
      }
      goto LAB_001195d7;
    }
    QColor::QColor(&local_30,this->value);
    QBrush::QBrush(aQStack_38,&local_30,SolidPattern);
    QTextFormat::setForeground(&__return_storage_ptr__->super_QTextFormat,aQStack_38);
  }
  QBrush::~QBrush(aQStack_38);
LAB_001195d7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QTextCharFormat QIBusAttribute::format() const
{
    QTextCharFormat fmt;
    switch (type) {
    case Invalid:
        break;
    case Underline: {
        QTextCharFormat::UnderlineStyle style = QTextCharFormat::NoUnderline;

        switch (value) {
        case UnderlineNone:
            break;
        case UnderlineSingle:
            style = QTextCharFormat::SingleUnderline;
            break;
        case UnderlineDouble:
            style = QTextCharFormat::DashUnderline;
            break;
        case UnderlineLow:
            style = QTextCharFormat::DashDotLine;
            break;
        case UnderlineError:
            style = QTextCharFormat::WaveUnderline;
            fmt.setUnderlineColor(Qt::red);
            break;
        }

        fmt.setUnderlineStyle(style);
        break;
    }
    case Foreground:
        fmt.setForeground(QColor(value));
        break;
    case Background:
        fmt.setBackground(QColor(value));
        break;
    }
    return fmt;
}